

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_parameters.cc
# Opt level: O2

void __thiscall xLearn::Model::SetBestModel(Model *this)

{
  int iVar1;
  real_t *prVar2;
  ostream *poVar3;
  allocator local_66;
  allocator local_65;
  Logger local_64;
  string local_60;
  string local_40;
  
  if (this->param_best_w_ == (real_t *)0x0) {
    prVar2 = (real_t *)malloc((ulong)this->param_num_w_ << 2);
    this->param_best_w_ = prVar2;
  }
  if (this->param_best_v_ == (real_t *)0x0) {
    iVar1 = std::__cxx11::string::compare((char *)this);
    if (iVar1 != 0) {
      iVar1 = posix_memalign(&this->param_best_v_,0x10,(ulong)this->param_num_v_ << 2);
      if (iVar1 != 0) {
        local_64.severity_ = ERR;
        std::__cxx11::string::string
                  ((string *)&local_40,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/data/model_parameters.cc"
                   ,&local_65);
        std::__cxx11::string::string((string *)&local_60,"SetBestModel",&local_66);
        poVar3 = Logger::Start(ERR,&local_40,0x157,&local_60);
        poVar3 = std::operator<<(poVar3,"CHECK_EQ failed ");
        poVar3 = std::operator<<(poVar3,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/data/model_parameters.cc"
                                );
        poVar3 = std::operator<<(poVar3,":");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x157);
        poVar3 = std::operator<<(poVar3,"\n");
        poVar3 = std::operator<<(poVar3,"ret");
        poVar3 = std::operator<<(poVar3," = ");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar1);
        poVar3 = std::operator<<(poVar3,"\n");
        poVar3 = std::operator<<(poVar3,"0");
        poVar3 = std::operator<<(poVar3," = ");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,0);
        std::operator<<(poVar3,"\n");
        std::__cxx11::string::~string((string *)&local_60);
        std::__cxx11::string::~string((string *)&local_40);
        Logger::~Logger(&local_64);
        abort();
      }
    }
  }
  if (this->param_best_b_ == (real_t *)0x0) {
    prVar2 = (real_t *)malloc((ulong)this->aux_size_ << 2);
    this->param_best_b_ = prVar2;
  }
  memcpy(this->param_best_w_,this->param_w_,(ulong)this->param_num_w_ << 2);
  memcpy(this->param_best_v_,this->param_v_,(ulong)this->param_num_v_ << 2);
  memcpy(this->param_best_b_,this->param_b_,(ulong)this->aux_size_ << 2);
  return;
}

Assistant:

void Model::SetBestModel() {
  try {
    if (param_best_w_ == nullptr) {
        param_best_w_ = (real_t*)malloc(
        param_num_w_*sizeof(real_t));
    }
    if (param_best_v_ == nullptr &&
        score_func_.compare("linear") != 0) {
  #ifdef _MSC_VER
        param_best_v_ = (decltype(param_best_v_))_aligned_malloc(
        param_num_v_ * sizeof(real_t),
        kAlignByte);
  #else
      int ret = posix_memalign(
                (void**)&param_best_v_,
                kAlignByte,
                param_num_v_ * sizeof(real_t));
      CHECK_EQ(ret, 0);
  #endif
    }
    if (param_best_b_ == nullptr) {
        param_best_b_ = (real_t*)malloc(
         aux_size_ * sizeof(real_t)
        );
    }
  } catch (std::bad_alloc&) {
    LOG(FATAL) << "Cannot allocate enough memory for current  \
                   model parameters. Parameter size: "
               << GetNumParameter();
  }
  // Copy current model parameters
  memcpy(param_best_w_, param_w_, param_num_w_*sizeof(real_t));
  memcpy(param_best_v_, param_v_, param_num_v_*sizeof(real_t));
  memcpy(param_best_b_, param_b_, aux_size_*sizeof(real_t));
}